

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_file.cpp
# Opt level: O2

void Omega_h::binary::write_int_file(path *filepath,Mesh *mesh,I32 value)

{
  char cVar1;
  I32 IVar2;
  value_type *pvVar3;
  ostream *poVar4;
  ofstream file;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_218 [63];
  
  Omega_h::Mesh::comm((Mesh *)&file);
  IVar2 = Comm::rank(_file);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_218);
  if (IVar2 == 0) {
    pvVar3 = filesystem::path::c_str(filepath);
    std::ofstream::ofstream(&file,pvVar3,_S_out);
    cVar1 = std::__basic_file<char>::is_open();
    if (cVar1 == '\0') {
      fail("assertion %s failed at %s +%d\n","file.is_open()",
           "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_file.cpp"
           ,0x1d6);
    }
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&file,value);
    std::operator<<(poVar4,'\n');
    std::ofstream::~ofstream(&file);
  }
  return;
}

Assistant:

static void write_int_file(
    filesystem::path const& filepath, Mesh* mesh, I32 value) {
  if (mesh->comm()->rank() == 0) {
    std::ofstream file(filepath.c_str());
    OMEGA_H_CHECK(file.is_open());
    file << value << '\n';
  }
}